

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Delaunay_psm.cpp
# Opt level: O0

void __thiscall GEO::LineInput::conversion_error(LineInput *this,index_t index,char *type)

{
  ostream *poVar1;
  char *pcVar2;
  logic_error *this_00;
  string local_1c8 [48];
  ostringstream local_198 [8];
  ostringstream out;
  char *type_local;
  index_t index_local;
  LineInput *this_local;
  
  std::__cxx11::ostringstream::ostringstream(local_198);
  poVar1 = std::operator<<((ostream *)local_198,"Line ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,this->line_num_);
  poVar1 = std::operator<<(poVar1,": field #");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,index);
  poVar1 = std::operator<<(poVar1," is not a valid ");
  poVar1 = std::operator<<(poVar1,type);
  poVar1 = std::operator<<(poVar1," value: ");
  pcVar2 = field(this,index);
  std::operator<<(poVar1,pcVar2);
  this_00 = (logic_error *)__cxa_allocate_exception(0x10);
  std::__cxx11::ostringstream::str();
  std::logic_error::logic_error(this_00,local_1c8);
  __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
}

Assistant:

void LineInput::conversion_error(index_t index, const char* type) const {
        std::ostringstream out;
        out << "Line " << line_num_
            << ": field #" << index
            << " is not a valid " << type << " value: " << field(index);
        throw std::logic_error(out.str());
    }